

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_geometric_normal_predictor_base.h
# Opt level: O0

VectorD<long,_3> * __thiscall
draco::
MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::GetPositionForCorner
          (MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex ci)

{
  CornerTable *pCVar1;
  MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_RSI;
  MeshAttributeCornerTable *in_RDI;
  value_type data_id;
  uint vert_id;
  CornerTable *corner_table;
  MeshAttributeCornerTable *this_00;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_28;
  uint local_24;
  int data_id_00;
  MeshPredictionSchemeGeometricNormalPredictorBase<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *this_01;
  
  this_00 = in_RDI;
  this_01 = in_RSI;
  pCVar1 = MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::corner_table
                     (&in_RSI->mesh_data_);
  data_id_00 = (int)((ulong)pCVar1 >> 0x20);
  local_28.value_ = (uint)MeshAttributeCornerTable::Vertex(this_00,(uint)in_RSI);
  local_24 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_28);
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable>::vertex_to_data_map(&in_RSI->mesh_data_)
  ;
  std::vector<int,_std::allocator<int>_>::at
            ((vector<int,_std::allocator<int>_> *)in_RSI,(size_type)this_00);
  GetPositionForDataId(this_01,data_id_00);
  return (VectorD<long,_3> *)in_RDI;
}

Assistant:

VectorD<int64_t, 3> GetPositionForCorner(CornerIndex ci) const {
    DRACO_DCHECK(this->IsInitialized());
    const auto corner_table = mesh_data_.corner_table();
    const auto vert_id = corner_table->Vertex(ci).value();
    const auto data_id = mesh_data_.vertex_to_data_map()->at(vert_id);
    return GetPositionForDataId(data_id);
  }